

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O0

int sys_run_scheduler(char *externalschedlibname,char *sys_extraflagsstring)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  code *pcVar4;
  void *dlobj;
  stat statbuf;
  char **dllextent;
  char filename [1000];
  t_externalschedlibmain externalmainfunc;
  char *sys_extraflagsstring_local;
  char *externalschedlibname_local;
  
  for (statbuf.__glibc_reserved[2] = (__syscall_slong_t)sys_dllextent;
      *(long *)statbuf.__glibc_reserved[2] != 0;
      statbuf.__glibc_reserved[2] = statbuf.__glibc_reserved[2] + 8) {
    snprintf((char *)&dllextent,1000,"%s%s",externalschedlibname,
             *(undefined8 *)statbuf.__glibc_reserved[2]);
    sys_bashfilename((char *)&dllextent,(char *)&dllextent);
    iVar1 = stat((char *)&dllextent,(stat *)&dlobj);
    if (iVar1 == 0) break;
  }
  lVar2 = dlopen(&dllextent,0x102);
  if (lVar2 == 0) {
    uVar3 = dlerror();
    pd_error((void *)0x0,"%s: %s",&dllextent,uVar3);
    __stream = _stderr;
    uVar3 = dlerror();
    fprintf(__stream,"dlopen failed for %s: %s\n",&dllextent,uVar3);
    externalschedlibname_local._4_4_ = 1;
  }
  else {
    pcVar4 = (code *)dlsym(lVar2,"pd_extern_sched");
    if (pcVar4 == (code *)0x0) {
      fprintf(_stderr,"%s: couldn\'t find pd_extern_sched() or main()\n",&dllextent);
      externalschedlibname_local._4_4_ = 0;
    }
    else {
      externalschedlibname_local._4_4_ = (*pcVar4)(sys_extraflagsstring);
    }
  }
  return externalschedlibname_local._4_4_;
}

Assistant:

int sys_run_scheduler(const char *externalschedlibname,
    const char *sys_extraflagsstring)
{
    typedef int (*t_externalschedlibmain)(const char *);
    t_externalschedlibmain externalmainfunc;
    char filename[MAXPDSTRING];
    const char**dllextent;
    for(dllextent=sys_dllextent; *dllextent; dllextent++)
    {
        struct stat statbuf;
        snprintf(filename, sizeof(filename), "%s%s", externalschedlibname,
            *dllextent);
        sys_bashfilename(filename, filename);
        if(!stat(filename, &statbuf))
            break;
    }

#ifdef _WIN32
    {
        HINSTANCE ntdll = LoadLibrary(filename);
        if (!ntdll)
        {
            fprintf(stderr, "%s: couldn't load external scheduler\n", filename);
            pd_error(0, "%s: couldn't load external scheduler", filename);
            return (1);
        }
        externalmainfunc =
            (t_externalschedlibmain)GetProcAddress(ntdll, "pd_extern_sched");
        if (!externalmainfunc)
            externalmainfunc =
                (t_externalschedlibmain)GetProcAddress(ntdll, "main");
    }
#elif defined HAVE_LIBDL
    {
        void *dlobj;
        dlobj = dlopen(filename, RTLD_NOW | RTLD_GLOBAL);
        if (!dlobj)
        {
            pd_error(0, "%s: %s", filename, dlerror());
            fprintf(stderr, "dlopen failed for %s: %s\n", filename, dlerror());
            return (1);
        }
        externalmainfunc = (t_externalschedlibmain)dlsym(dlobj,
            "pd_extern_sched");
    }
#else
    return (0);
#endif
    if (externalmainfunc)
        return((*externalmainfunc)(sys_extraflagsstring));
    else
    {
        fprintf(stderr, "%s: couldn't find pd_extern_sched() or main()\n",
            filename);
        return (0);
    }
}